

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

float Nwk_NodePropagateRequired(Nwk_Obj_t *pObj,int fUseSorting)

{
  float (*pafVar1) [33];
  uint uVar2;
  If_LibLut_t *pIVar3;
  Nwk_Obj_t *pNVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_118 [32];
  float local_98 [34];
  
  if ((*(uint *)&pObj->field_0x20 & 7) == 3) {
    pIVar3 = pObj->pMan->pLutLib;
    uVar2 = pObj->nFanins;
    if (pIVar3 == (If_LibLut_t *)0x0) {
      fVar7 = pObj->tRequired + -1.0;
      uVar6 = 0;
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar6;
      }
      for (; (uVar5 != uVar6 && (pNVar4 = pObj->pFanio[uVar6], pNVar4 != (Nwk_Obj_t *)0x0));
          uVar6 = uVar6 + 1) {
        if (fVar7 < pNVar4->tRequired) {
          pNVar4->tRequired = fVar7;
        }
      }
    }
    else {
      pafVar1 = pIVar3->pLutDelays + (int)uVar2;
      if (pIVar3->fVarPinDelays == 0) {
        fVar7 = pObj->tRequired - (*pafVar1)[0];
        uVar6 = 0;
        uVar5 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar5 = uVar6;
        }
        for (; (uVar5 != uVar6 && (pNVar4 = pObj->pFanio[uVar6], pNVar4 != (Nwk_Obj_t *)0x0));
            uVar6 = uVar6 + 1) {
          if (fVar7 < pNVar4->tRequired) {
            pNVar4->tRequired = fVar7;
          }
        }
      }
      else if (fUseSorting == 0) {
        uVar6 = 0;
        uVar5 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar5 = uVar6;
        }
        fVar7 = 0.0;
        for (; (uVar5 != uVar6 && (pNVar4 = pObj->pFanio[uVar6], pNVar4 != (Nwk_Obj_t *)0x0));
            uVar6 = uVar6 + 1) {
          fVar7 = pObj->tRequired - (*pafVar1)[uVar6];
          if (fVar7 < pNVar4->tRequired) {
            pNVar4->tRequired = fVar7;
          }
        }
      }
      else {
        Nwk_ManDelayTraceSortPins(pObj,local_118,local_98);
        uVar6 = 0;
        uVar5 = (ulong)(uint)pObj->nFanins;
        if (pObj->nFanins < 1) {
          uVar5 = uVar6;
        }
        fVar7 = 0.0;
        for (; (uVar5 != uVar6 && (pObj->pFanio[uVar6] != (Nwk_Obj_t *)0x0)); uVar6 = uVar6 + 1) {
          fVar7 = pObj->tRequired - (*pafVar1)[uVar6];
          pNVar4 = pObj->pFanio[local_118[uVar6]];
          if (fVar7 < pNVar4->tRequired) {
            pNVar4->tRequired = fVar7;
          }
        }
      }
    }
    return fVar7;
  }
  __assert_fail("Nwk_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                ,0x111,"float Nwk_NodePropagateRequired(Nwk_Obj_t *, int)");
}

Assistant:

float Nwk_NodePropagateRequired( Nwk_Obj_t * pObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = pObj->pMan->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    Nwk_Obj_t * pFanin;
    float tRequired = 0.0; // Suppress "might be used uninitialized"
    float * pDelays;
    int k;
    assert( Nwk_ObjIsNode(pObj) );
    if ( pLutLib == NULL )
    {
        tRequired = Nwk_ObjRequired(pObj) - (float)1.0;
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( Nwk_ObjRequired(pFanin) > tRequired )
                Nwk_ObjSetRequired( pFanin, tRequired );
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        tRequired = Nwk_ObjRequired(pObj) - pDelays[0];
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( Nwk_ObjRequired(pFanin) > tRequired )
                Nwk_ObjSetRequired( pFanin, tRequired );
    }
    else 
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        if ( fUseSorting )
        {
            Nwk_ManDelayTraceSortPins( pObj, pPinPerm, pPinDelays );
            Nwk_ObjForEachFanin( pObj, pFanin, k )
            {
                tRequired = Nwk_ObjRequired(pObj) - pDelays[k];
                if ( Nwk_ObjRequired(Nwk_ObjFanin(pObj,pPinPerm[k])) > tRequired )
                    Nwk_ObjSetRequired( Nwk_ObjFanin(pObj,pPinPerm[k]), tRequired );
            }
        }
        else
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
            {
                tRequired = Nwk_ObjRequired(pObj) - pDelays[k];
                if ( Nwk_ObjRequired(pFanin) > tRequired )
                    Nwk_ObjSetRequired( pFanin, tRequired );
            }
        }
    }
    return tRequired;
}